

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fCopyImageTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::anon_unknown_0::Copy::Copy
          (Copy *this,IVec3 *srcPos_,int srcLevel_,IVec3 *dstPos_,int dstLevel_,IVec3 *size_,
          IVec3 *dstSize_)

{
  tcu::Vector<int,_3>::Vector(&this->srcPos,srcPos_);
  this->srcLevel = srcLevel_;
  tcu::Vector<int,_3>::Vector(&this->dstPos,dstPos_);
  this->dstLevel = dstLevel_;
  tcu::Vector<int,_3>::Vector(&this->size,size_);
  tcu::Vector<int,_3>::Vector(&this->dstSize,dstSize_);
  return;
}

Assistant:

Copy (const IVec3&	srcPos_,
		  int			srcLevel_,

		  const IVec3&	dstPos_,
		  int			dstLevel_,

		  const IVec3&	size_,
		  const IVec3&	dstSize_)
		: srcPos	(srcPos_)
		, srcLevel	(srcLevel_)

		, dstPos	(dstPos_)
		, dstLevel	(dstLevel_)

		, size		(size_)
		, dstSize	(dstSize_)
	{
	}